

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::handleFORMULA(Record *record,Stream *stream,size_t sheetIdx,IStorage *storage)

{
  ValueType VVar1;
  long *in_RCX;
  undefined8 in_RDX;
  vector<int,_std::allocator<int>_> borders;
  Record stringRecord;
  Formula formula;
  wstring *str;
  Record *this;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda0;
  Record *in_stack_fffffffffffffda8;
  Record *in_stack_fffffffffffffdb0;
  wstring local_240 [9];
  BiffVersion in_stack_fffffffffffffee8;
  int32_t in_stack_fffffffffffffeec;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  Stream *in_stack_fffffffffffffef8;
  undefined1 local_60 [96];
  
  this = (Record *)local_60;
  local_60._64_8_ = in_RCX;
  local_60._72_8_ = in_RDX;
  Formula::Formula((Formula *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  VVar1 = Formula::valueType((Formula *)this);
  if (VVar1 == StringValue) {
    Record::Record(in_stack_fffffffffffffdb0,(Stream *)in_stack_fffffffffffffda8);
    str = local_240;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x114ce0);
    Record::dataStream((Record *)((long)&local_240[0].field_2 + 8));
    loadString_abi_cxx11_
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
               in_stack_fffffffffffffee8);
    Formula::setString((Formula *)this,str);
    std::__cxx11::wstring::~wstring((wstring *)&stack0xfffffffffffffda0);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffda0);
    Record::~Record(this);
  }
  (**(code **)(*(long *)local_60._64_8_ + 0x40))(local_60._64_8_,local_60._72_8_,local_60);
  Formula::~Formula((Formula *)0x114dcf);
  return;
}

Assistant:

inline void
Parser::handleFORMULA( Record & record, Stream & stream, size_t sheetIdx, IStorage & storage )
{
	Formula formula( record );

	if( formula.valueType() == Formula::StringValue )
	{
		Record stringRecord( stream );

		std::vector< int32_t > borders;

		formula.setString( loadString( stringRecord.dataStream(), borders ) );
	}

	storage.onCell( sheetIdx, formula );
}